

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryCopy(TranslateToFuzzReader *this)

{
  uintptr_t *puVar1;
  uintptr_t uVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  uintptr_t uVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  Expression *pEVar8;
  Expression *pEVar9;
  
  if (this->allowMemory != false) {
    pEVar6 = makePointer(this);
    pEVar7 = makePointer(this);
    pEVar8 = make(this,(Type)*(uintptr_t *)(**(long **)(this->wasm + 0x78) + 0x50));
    puVar1 = (uintptr_t *)**(long **)(this->wasm + 0x78);
    uVar2 = *puVar1;
    uVar3 = puVar1[1];
    uVar4 = *puVar1;
    uVar5 = puVar1[1];
    pEVar9 = (Expression *)
             MixedArena::allocSpace((MixedArena *)((this->builder).wasm + 0x200),0x48,8);
    *(undefined8 *)pEVar9 = 0;
    (pEVar9->type).id = 0;
    *(undefined8 *)(pEVar9 + 3) = 0;
    pEVar9[3].type.id = 0;
    *(undefined8 *)(pEVar9 + 2) = 0;
    pEVar9[2].type.id = 0;
    *(undefined8 *)(pEVar9 + 4) = 0;
    *(undefined8 *)(pEVar9 + 1) = 0;
    pEVar9[1].type.id = 0;
    pEVar9->_id = MemoryCopyId;
    (pEVar9->type).id = 0;
    pEVar9[2].type.id = 0;
    *(undefined8 *)(pEVar9 + 3) = 0;
    pEVar9[3].type.id = 0;
    *(undefined8 *)(pEVar9 + 4) = 0;
    *(Expression **)(pEVar9 + 1) = pEVar6;
    pEVar9[1].type.id = (uintptr_t)pEVar7;
    *(Expression **)(pEVar9 + 2) = pEVar8;
    pEVar9[2].type.id = uVar2;
    *(uintptr_t *)(pEVar9 + 3) = uVar3;
    pEVar9[3].type.id = uVar4;
    *(uintptr_t *)(pEVar9 + 4) = uVar5;
    wasm::MemoryCopy::finalize();
    return pEVar9;
  }
  pEVar6 = makeTrivial(this,(Type)0x0);
  return pEVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryCopy() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Expression* dest = makePointer();
  Expression* source = makePointer();
  Expression* size = make(wasm.memories[0]->addressType);
  return builder.makeMemoryCopy(
    dest, source, size, wasm.memories[0]->name, wasm.memories[0]->name);
}